

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O0

void __thiscall
AnalyserExternalVariable_addDependencyFromDifferentModel_Test::
~AnalyserExternalVariable_addDependencyFromDifferentModel_Test
          (AnalyserExternalVariable_addDependencyFromDifferentModel_Test *this)

{
  AnalyserExternalVariable_addDependencyFromDifferentModel_Test *this_local;
  
  ~AnalyserExternalVariable_addDependencyFromDifferentModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, addDependencyFromDifferentModel)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto other_model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    externalVariable->addDependency(other_model->component("membrane")->variable("Cm"));

    EXPECT_EQ(size_t(0), externalVariable->dependencyCount());
}